

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_19::BinaryReader::ReadInitExpr(BinaryReader *this,Index index,bool require_i32)

{
  bool bVar1;
  Result RVar2;
  int iVar3;
  undefined7 in_register_00000011;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *pcVar4;
  undefined1 auStack_48 [8];
  v128 value_bits;
  Opcode opcode;
  
  RVar2 = ReadOpcode(this,(Opcode *)(value_bits.v + 3),
                     (char *)CONCAT71(in_register_00000011,require_i32));
  if (RVar2.enum_ == Error) {
    return (Result)Error;
  }
  bVar1 = Opcode::IsEnabled((Opcode *)(value_bits.v + 3),&this->options_->features);
  if (!bVar1) {
    pcVar4 = (char *)0x0;
LAB_00d7d934:
    RVar2 = ReportUnexpectedOpcode(this,(Opcode)value_bits.v[3],pcVar4);
    return (Result)RVar2.enum_;
  }
  switch(value_bits.v[3]) {
  case 0x34:
    auStack_48 = (undefined1  [8])((ulong)(uint)auStack_48._4_4_ << 0x20);
    RVar2 = ReadS32Leb128(this,(uint32_t *)auStack_48,"init_expr i32.const value");
    if (RVar2.enum_ == Error) {
      return (Result)Error;
    }
    iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xb3])
                      (this->delegate_,(ulong)index,(ulong)auStack_48 & 0xffffffff);
    pcVar4 = extraout_RDX_00;
    if (iVar3 != 0) {
      pcVar4 = "OnInitExprI32ConstExpr callback failed";
      goto LAB_00d7db02;
    }
    break;
  case 0x35:
    auStack_48 = (undefined1  [8])0x0;
    RVar2 = ReadS64Leb128(this,(uint64_t *)auStack_48,"init_expr i64.const value");
    if (RVar2.enum_ == Error) {
      return (Result)Error;
    }
    iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xb4])
                      (this->delegate_,(ulong)index,auStack_48);
    pcVar4 = extraout_RDX_04;
    if (iVar3 != 0) {
      pcVar4 = "OnInitExprI64ConstExpr callback failed";
      goto LAB_00d7db02;
    }
    break;
  case 0x36:
    auStack_48 = (undefined1  [8])((ulong)(uint)auStack_48._4_4_ << 0x20);
    RVar2 = ReadF32(this,(uint32_t *)auStack_48,"init_expr f32.const value");
    if (RVar2.enum_ == Error) {
      return (Result)Error;
    }
    iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xaf])
                      (this->delegate_,(ulong)index,(ulong)auStack_48 & 0xffffffff);
    pcVar4 = extraout_RDX_02;
    if (iVar3 != 0) {
      pcVar4 = "OnInitExprF32ConstExpr callback failed";
      goto LAB_00d7db02;
    }
    break;
  case 0x37:
    auStack_48 = (undefined1  [8])0x0;
    RVar2 = ReadF64(this,(uint64_t *)auStack_48,"init_expr f64.const value");
    if (RVar2.enum_ == Error) {
      return (Result)Error;
    }
    iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xb0])
                      (this->delegate_,(ulong)index,auStack_48);
    pcVar4 = extraout_RDX_03;
    if (iVar3 != 0) {
      pcVar4 = "OnInitExprF64ConstExpr callback failed";
      goto LAB_00d7db02;
    }
    break;
  default:
    if (value_bits.v[3] == 0xb) {
      return (Result)Ok;
    }
    if (value_bits.v[3] == 0x19) {
      RVar2 = ReadIndex(this,(Index *)auStack_48,"init_expr get_global index");
      if (RVar2.enum_ == Error) {
        return (Result)Error;
      }
      iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xb2])
                        (this->delegate_,(ulong)index,(ulong)auStack_48 & 0xffffffff);
      pcVar4 = extraout_RDX_01;
      if (iVar3 != 0) {
        pcVar4 = "OnInitExprGetGlobalExpr callback failed";
        goto LAB_00d7db02;
      }
    }
    else {
      if (value_bits.v[3] != 0xce) {
        pcVar4 = "in initializer expression";
        goto LAB_00d7d934;
      }
      auStack_48 = (undefined1  [8])0x0;
      value_bits.v[0] = 0;
      value_bits.v[1] = 0;
      RVar2 = ReadV128(this,(v128 *)auStack_48,"init_expr v128.const value");
      if (RVar2.enum_ == Error) {
        return (Result)Error;
      }
      iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xb1])
                        (this->delegate_,(ulong)index,auStack_48,value_bits.v._0_8_);
      pcVar4 = extraout_RDX;
      if (iVar3 != 0) {
        pcVar4 = "OnInitExprV128ConstExpr callback failed";
        goto LAB_00d7db02;
      }
    }
  }
  if (((require_i32) && (value_bits.v[3] != 0x19)) && (value_bits.v[3] != 0x34)) {
    pcVar4 = "expected i32 init_expr";
  }
  else {
    RVar2 = ReadOpcode(this,(Opcode *)(value_bits.v + 3),pcVar4);
    if (RVar2.enum_ == Error) {
      return (Result)Error;
    }
    if (value_bits.v[3] == 0xb) {
      return (Result)Ok;
    }
    pcVar4 = "expected END opcode after initializer expression";
  }
LAB_00d7db02:
  PrintError(this,pcVar4);
  return (Result)Error;
}

Assistant:

Result BinaryReader::ReadInitExpr(Index index, bool require_i32) {
  Opcode opcode;
  CHECK_RESULT(ReadOpcode(&opcode, "opcode"));
  ERROR_UNLESS_OPCODE_ENABLED(opcode);

  switch (opcode) {
    case Opcode::I32Const: {
      uint32_t value = 0;
      CHECK_RESULT(ReadS32Leb128(&value, "init_expr i32.const value"));
      CALLBACK(OnInitExprI32ConstExpr, index, value);
      break;
    }

    case Opcode::I64Const: {
      uint64_t value = 0;
      CHECK_RESULT(ReadS64Leb128(&value, "init_expr i64.const value"));
      CALLBACK(OnInitExprI64ConstExpr, index, value);
      break;
    }

    case Opcode::F32Const: {
      uint32_t value_bits = 0;
      CHECK_RESULT(ReadF32(&value_bits, "init_expr f32.const value"));
      CALLBACK(OnInitExprF32ConstExpr, index, value_bits);
      break;
    }

    case Opcode::F64Const: {
      uint64_t value_bits = 0;
      CHECK_RESULT(ReadF64(&value_bits, "init_expr f64.const value"));
      CALLBACK(OnInitExprF64ConstExpr, index, value_bits);
      break;
    }

    case Opcode::V128Const: {
      v128 value_bits;
      ZeroMemory(value_bits);
      CHECK_RESULT(ReadV128(&value_bits, "init_expr v128.const value"));
      CALLBACK(OnInitExprV128ConstExpr, index, value_bits);
      break;
    }

    case Opcode::GetGlobal: {
      Index global_index;
      CHECK_RESULT(ReadIndex(&global_index, "init_expr get_global index"));
      CALLBACK(OnInitExprGetGlobalExpr, index, global_index);
      break;
    }

    case Opcode::End:
      return Result::Ok;

    default:
      return ReportUnexpectedOpcode(opcode, "in initializer expression");
  }

  if (require_i32 && opcode != Opcode::I32Const &&
      opcode != Opcode::GetGlobal) {
    PrintError("expected i32 init_expr");
    return Result::Error;
  }

  CHECK_RESULT(ReadOpcode(&opcode, "opcode"));
  ERROR_UNLESS(opcode == Opcode::End,
               "expected END opcode after initializer expression");
  return Result::Ok;
}